

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O2

ImRect __thiscall ImGuiWindow::MenuBarRect(ImGuiWindow *this)

{
  float fVar1;
  ImVec2 IVar2;
  float fVar3;
  float fVar4;
  ImRect IVar5;
  float local_18;
  
  fVar1 = (this->Pos).y;
  fVar3 = TitleBarHeight(this);
  fVar3 = fVar3 + fVar1;
  IVar2 = this->SizeFull;
  fVar1 = (this->Pos).x;
  fVar4 = MenuBarHeight(this);
  local_18 = IVar2.x;
  IVar5.Min.y = fVar3;
  IVar5.Min.x = fVar1;
  IVar5.Max.x = local_18 + fVar1;
  IVar5.Max.y = fVar4 + fVar3;
  return IVar5;
}

Assistant:

ImRect      MenuBarRect() const     { float y1 = Pos.y + TitleBarHeight(); return ImRect(Pos.x, y1, Pos.x + SizeFull.x, y1 + MenuBarHeight()); }